

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

XrDebugUtilsMessageSeverityFlagsEXT
LoaderLogMessageSeveritiesToDebugUtilsMessageSeverities
          (XrLoaderLogMessageSeverityFlags log_severities)

{
  ulong local_18;
  XrDebugUtilsMessageSeverityFlagsEXT utils_severities;
  XrLoaderLogMessageSeverityFlags log_severities_local;
  
  local_18 = (ulong)((log_severities & 1) != 0);
  if ((log_severities & 0x10) != 0) {
    local_18 = local_18 | 0x10;
  }
  if ((log_severities & 0x100) != 0) {
    local_18 = local_18 | 0x100;
  }
  if ((log_severities & 0x1000) != 0) {
    local_18 = local_18 | 0x1000;
  }
  return local_18;
}

Assistant:

XrDebugUtilsMessageSeverityFlagsEXT LoaderLogMessageSeveritiesToDebugUtilsMessageSeverities(
    XrLoaderLogMessageSeverityFlags log_severities) {
    XrDebugUtilsMessageSeverityFlagsEXT utils_severities = 0UL;
    if ((log_severities & XR_LOADER_LOG_MESSAGE_SEVERITY_VERBOSE_BIT) != 0u) {
        utils_severities |= XR_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT;
    }
    if ((log_severities & XR_LOADER_LOG_MESSAGE_SEVERITY_INFO_BIT) != 0u) {
        utils_severities |= XR_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT;
    }
    if ((log_severities & XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT) != 0u) {
        utils_severities |= XR_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT;
    }
    if ((log_severities & XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT) != 0u) {
        utils_severities |= XR_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT;
    }
    return utils_severities;
}